

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

int libj1939_create_epoll(void)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  int epoll_fd;
  int ret;
  uint local_4;
  
  local_4 = epoll_create1(0);
  if ((int)local_4 < 0) {
    piVar1 = __errno_location();
    __stream = _stderr;
    local_4 = -*piVar1;
    pcVar2 = strerror(local_4);
    fprintf(__stream,"epoll_create1: %d (%s)",(ulong)local_4,pcVar2);
  }
  return local_4;
}

Assistant:

int libj1939_create_epoll(void)
{
	int ret, epoll_fd;

	epoll_fd = epoll_create1(0);
	if (epoll_fd < 0) {
		ret = -errno;
		pr_err("epoll_create1: %d (%s)", ret, strerror(ret));
		return ret;
	}

	return epoll_fd;
}